

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecc-ssh.c
# Opt level: O0

char * ecdsa_cache_str(ssh_key *key)

{
  char *pcVar1;
  char *toret;
  mp_int *y;
  mp_int *x;
  ecdsa_key *ek;
  ssh_key *key_local;
  
  x = (mp_int *)(key + -3);
  ek = (ecdsa_key *)key;
  ecc_weierstrass_get_affine((WeierstrassPoint *)key[-2].vt,&y,(mp_int **)&toret);
  pcVar1 = ecc_cache_str_shared(*(char **)(x->nw + 8),y,(mp_int *)toret);
  mp_free(y);
  mp_free((mp_int *)toret);
  return pcVar1;
}

Assistant:

static char *ecdsa_cache_str(ssh_key *key)
{
    struct ecdsa_key *ek = container_of(key, struct ecdsa_key, sshk);
    mp_int *x, *y;

    ecc_weierstrass_get_affine(ek->publicKey, &x, &y);
    char *toret = ecc_cache_str_shared(ek->curve->name, x, y);
    mp_free(x);
    mp_free(y);
    return toret;
}